

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

void monster_group_remove_leader(chunk_conflict *c,monster *leader,monster_group *group)

{
  monster_group *group_00;
  _Bool _Var1;
  monster *pmVar2;
  chunk_conflict *c_00;
  ulong uVar3;
  long lVar4;
  wchar_t wVar5;
  uint uVar6;
  ulong uVar7;
  mon_group_list_entry **ppmVar8;
  mon_group_list_entry *pmVar9;
  mon_group_list_entry **ppmVar10;
  
  wVar5 = L'\0';
  ppmVar10 = &group->member_list;
  ppmVar8 = ppmVar10;
  while (pmVar9 = *ppmVar8, pmVar9 != (mon_group_list_entry *)0x0) {
    pmVar2 = cave_monster(c,pmVar9->midx);
    if (pmVar2 != (monster *)0x0) {
      if ((leader->race == pmVar2->race) && (wVar5 == L'\0')) {
        wVar5 = L'\0';
        if (pmVar2->group_info[0].role != MON_GROUP_SUMMON) {
          wVar5 = pmVar2->midx;
        }
      }
      _Var1 = monster_is_unique(pmVar2);
      if (_Var1) {
        wVar5 = pmVar2->midx;
      }
    }
    ppmVar8 = &pmVar9->next;
  }
  if (wVar5 == L'\0') {
    c_00 = (chunk_conflict *)mem_zalloc((ulong)z_info->level_monster_max << 2);
    uVar6 = 0;
    while (pmVar9 = *ppmVar10, pmVar9 != (mon_group_list_entry *)0x0) {
      pmVar2 = c->monsters + pmVar9->midx;
      uVar3 = 0;
      if (0 < (int)uVar6) {
        uVar3 = (ulong)uVar6;
      }
      uVar7 = 0;
      do {
        if (uVar3 == uVar7) goto LAB_0016ba16;
        wVar5 = *(wchar_t *)((long)&c_00->name + uVar7 * 4);
        group_00 = c->monster_groups[wVar5];
        uVar7 = uVar7 + 1;
      } while (c->monsters[group_00->member_list->midx].race != pmVar2->race);
      pmVar2->group_info[0].index = wVar5;
      pmVar2->group_info[0].role = MON_GROUP_MEMBER;
      monster_add_to_group((chunk_conflict *)(long)wVar5,pmVar2,group_00);
LAB_0016ba16:
      if (pmVar2->group_info[0].index == group->index) {
        monster_group_start(c,pmVar2,L'\0');
        lVar4 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        *(wchar_t *)((long)&c_00->name + lVar4 * 4) = pmVar2->group_info[0].index;
      }
      ppmVar10 = &pmVar9->next;
    }
    mem_free(c_00);
    c->monster_groups[group->index] = (monster_group *)0x0;
    monster_group_free(c_00,group);
  }
  else {
    group->leader = wVar5;
    pmVar9 = group->member_list;
    if (pmVar9 == (mon_group_list_entry *)0x0) {
      __assert_fail("list_entry",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-group.c"
                    ,0x85,
                    "void monster_group_remove_leader(struct chunk *, struct monster *, struct monster_group *)"
                   );
    }
    for (; pmVar9 != (mon_group_list_entry *)0x0; pmVar9 = pmVar9->next) {
      pmVar2 = cave_monster(c,pmVar9->midx);
      if (pmVar2->midx == wVar5) {
        pmVar2->group_info[0].role = MON_GROUP_LEADER;
        break;
      }
    }
  }
  monster_groups_verify(c);
  return;
}

Assistant:

static void monster_group_remove_leader(struct chunk *c, struct monster *leader,
										struct monster_group *group)
{
	struct mon_group_list_entry *list_entry = group->member_list;
	int poss_leader = 0;

	/* Look for another leader */
	while (list_entry) {
		struct monster *mon = cave_monster(c, list_entry->midx);

		if (!mon) {
			list_entry = list_entry->next;
			continue;
		}

		/* Monsters of the same race can take over as leader */
		if ((leader->race == mon->race) && !poss_leader
			&& (mon->group_info[PRIMARY_GROUP].role != MON_GROUP_SUMMON)) {
			poss_leader = mon->midx;
		}

		/* Uniques always take over */
		if (monster_is_unique(mon)) {
			poss_leader = mon->midx;
		}
		list_entry = list_entry->next;
	}

	/* If no new leader, group fractures and old group is removed */
	if (!poss_leader) {
		monster_group_split(c, group, leader);
		c->monster_groups[group->index] = NULL;
		monster_group_free(c, group);
	} else {
		/* If there is a successor, appoint them and finalise changes */
		group->leader = poss_leader;
		list_entry = group->member_list;
		assert(list_entry);
		while (list_entry) {
			struct monster *mon = cave_monster(c, list_entry->midx);

			/* Record the leader */
			if (mon->midx == poss_leader) {
				mon->group_info[PRIMARY_GROUP].role = MON_GROUP_LEADER;
				break;
			}
			list_entry = list_entry->next;
		}
	}
	monster_groups_verify(c);
}